

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs7_x509.cc
# Opt level: O0

int pkcs7_bundle_certificates_cb(CBB *out,void *arg)

{
  undefined8 uVar1;
  int iVar2;
  size_t sVar3;
  bool local_81;
  int len;
  uint8_t *buf;
  X509 *x509;
  CBB certificates;
  size_t i;
  stack_st_X509 *certs;
  void *arg_local;
  CBB *out_local;
  
  iVar2 = CBB_add_asn1(out,(CBB *)&x509,0xa0000000);
  if (iVar2 == 0) {
    out_local._4_4_ = 0;
  }
  else {
    for (certificates.u._24_8_ = 0; uVar1 = certificates.u._24_8_,
        sVar3 = sk_X509_num((stack_st_X509 *)arg), (ulong)uVar1 < sVar3;
        certificates.u._24_8_ = certificates.u._24_8_ + 1) {
      buf = (uint8_t *)sk_X509_value((stack_st_X509 *)arg,certificates.u._24_8_);
      iVar2 = i2d_X509((X509 *)buf,(uint8_t **)0x0);
      if (((iVar2 < 0) ||
          (iVar2 = CBB_add_space((CBB *)&x509,(uint8_t **)&stack0xffffffffffffff90,(long)iVar2),
          iVar2 == 0)) ||
         (iVar2 = i2d_X509((X509 *)buf,(uint8_t **)&stack0xffffffffffffff90), iVar2 < 0)) {
        return 0;
      }
    }
    iVar2 = CBB_flush_asn1_set_of((CBB *)&x509);
    local_81 = false;
    if (iVar2 != 0) {
      iVar2 = CBB_flush(out);
      local_81 = iVar2 != 0;
    }
    out_local._4_4_ = (uint)local_81;
  }
  return out_local._4_4_;
}

Assistant:

static int pkcs7_bundle_certificates_cb(CBB *out, void *arg) {
  auto *certs = static_cast<const STACK_OF(X509) *>(arg);
  size_t i;
  CBB certificates;

  // See https://tools.ietf.org/html/rfc2315#section-9.1
  if (!CBB_add_asn1(out, &certificates,
                    CBS_ASN1_CONTEXT_SPECIFIC | CBS_ASN1_CONSTRUCTED | 0)) {
    return 0;
  }

  for (i = 0; i < sk_X509_num(certs); i++) {
    X509 *x509 = sk_X509_value(certs, i);
    uint8_t *buf;
    int len = i2d_X509(x509, NULL);

    if (len < 0 || !CBB_add_space(&certificates, &buf, len) ||
        i2d_X509(x509, &buf) < 0) {
      return 0;
    }
  }

  // |certificates| is a implicitly-tagged SET OF.
  return CBB_flush_asn1_set_of(&certificates) && CBB_flush(out);
}